

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * QUtil::path_basename(string *__return_storage_ptr__,string *filename)

{
  ulong uVar1;
  size_type sVar2;
  string asStack_48 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  sVar2 = __return_storage_ptr__->_M_string_length;
  while( true ) {
    if (sVar2 < 2) {
      return __return_storage_ptr__;
    }
    uVar1 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x229961);
    if (uVar1 != sVar2 - 1) break;
    std::__cxx11::string::pop_back();
    sVar2 = uVar1;
  }
  if (uVar1 == 0xffffffffffffffff) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)asStack_48,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::path_basename(std::string const& filename)
{
#ifdef _WIN32
    char const* pathsep = "/\\";
#else
    char const* pathsep = "/";
#endif
    std::string last = filename;
    auto len = last.length();
    while (len > 1) {
        auto pos = last.find_last_of(pathsep);
        if (pos == len - 1) {
            last.pop_back();
            --len;
        } else if (pos == std::string::npos) {
            break;
        } else {
            last = last.substr(pos + 1);
            break;
        }
    }
    return last;
}